

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_not_8_al(void)

{
  uint address;
  uint uVar1;
  uint value;
  uint res;
  uint ea;
  
  address = m68ki_read_imm_32();
  uVar1 = m68ki_read_8_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  value = (uVar1 ^ 0xffffffff) & 0xff;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_not_8_al(void)
{
	uint ea = EA_AL_8();
	uint res = MASK_OUT_ABOVE_8(~m68ki_read_8(ea));

	m68ki_write_8(ea, res);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}